

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O3

size_t __thiscall
OpenMesh::PropertyT<short>::restore(PropertyT<short> *this,istream *_istr,bool _swap)

{
  size_t sVar1;
  
  sVar1 = IO::binary<std::vector<short,_std::allocator<short>_>_>::restore(_istr,&this->data_,_swap)
  ;
  return sVar1;
}

Assistant:

virtual size_t restore( std::istream& _istr, bool _swap )
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::restore(_istr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::restore( _istr, data_[i], _swap );
    return bytes;
  }